

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O3

ztresult_t savehandler_uint(char *name,ztuint_t *pvalue,size_t nelems,size_t stride,void *opaque)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  char *fmt;
  size_t sVar4;
  ulong uVar5;
  
  if (nelems == 1) {
    emitf((savestate_t *)opaque,"%s = $%X;\n",name,(ulong)*pvalue);
  }
  else {
    emitf((savestate_t *)opaque,"%s = [\n",name);
    iVar3 = *(int *)((long)opaque + 0xc);
    *(int *)((long)opaque + 0xc) = iVar3 + 1;
    if (nelems != 0) {
      uVar5 = 0;
      do {
        uVar1 = uVar5 + stride;
        sVar4 = stride;
        if (uVar5 < uVar1) {
          do {
            fmt = "$%X";
            if (uVar5 < nelems - 1) {
              fmt = "$%X, ";
            }
            uVar2 = *pvalue;
            pvalue = pvalue + 1;
            emitf((savestate_t *)opaque,fmt,(ulong)uVar2);
            uVar5 = uVar5 + 1;
            sVar4 = sVar4 - 1;
          } while (sVar4 != 0);
        }
        emitf((savestate_t *)opaque,"\n");
        uVar5 = uVar1;
      } while (uVar1 < nelems);
      iVar3 = *(int *)((long)opaque + 0xc) + -1;
    }
    *(int *)((long)opaque + 0xc) = iVar3;
    emitf((savestate_t *)opaque,"];\n");
  }
  return 0;
}

Assistant:

static ztresult_t savehandler_uint(const char     *name,
                                   const ztuint_t *pvalue,
                                   size_t          nelems,
                                   size_t          stride,
                                   void           *opaque)
{
  savestate_t *state = opaque;
  DUMP(word_t);
  return ztresult_OK;
}